

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::http::~http(http *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  int iVar4;
  error_code e;
  undefined4 local_28 [2];
  undefined8 local_20;
  
  (this->super_connection)._vptr_connection = (_func_int **)&PTR__http_0028dd48;
  iVar4 = booster::aio::basic_io_device::native();
  if (iVar4 != -1) {
    local_28[0] = 0;
    local_20 = std::_V2::system_category();
    booster::aio::stream_socket::shutdown(&this->socket_,2,local_28);
  }
  pcVar1 = (this->remote_ip_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->remote_ip_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ip_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ip_).field_2) {
    operator_delete(pcVar1);
  }
  p_Var2 = (this->rewrite_).
           super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->watchdog_).
           super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pcVar1 = (this->chunked_header_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chunked_header_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->response_headers_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->response_headers_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->input_parser_).header_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->input_parser_).header_.field_2) {
    operator_delete(pcVar1);
  }
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)&(this->input_parser_).ungot_);
  pcVar3 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3);
  }
  booster::aio::stream_socket::~stream_socket(&this->socket_);
  connection::~connection(&this->super_connection);
  return;
}

Assistant:

~http()
		{
			if(socket_.native()!=io::invalid_socket) {
				booster::system::error_code e;
				socket_.shutdown(io::stream_socket::shut_rdwr,e);
			}
		}